

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuSloppyState::reset(QMenuSloppyState *this)

{
  long lVar1;
  bool bVar2;
  QMenuPrivate *pQVar3;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect *this_00;
  QRect *in_stack_ffffffffffffffb8;
  QRectF *in_stack_ffffffffffffffc0;
  undefined8 local_28;
  QWidgetData *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(byte *)&in_RDI[6].y2.m_i = (byte)in_RDI[6].y2.m_i & 0xfe;
  *(undefined1 *)((long)&in_RDI[6].x2.m_i + 3) = 1;
  *(undefined1 *)((long)&in_RDI[6].x2.m_i + 2) = 0;
  *(byte *)&in_RDI[6].y2.m_i = (byte)in_RDI[6].y2.m_i & 0xdf | 0x20;
  *(undefined2 *)&in_RDI[6].y1.m_i = 0;
  this_00 = in_RDI;
  QBasicTimer::stop();
  in_RDI->x2 = 0;
  in_RDI->y2 = 0;
  in_RDI[1].x1 = 0;
  in_RDI[1].y1 = 0;
  QRect::QRect(this_00);
  QRectF::QRectF(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  in_RDI[1].x2 = (Representation)(undefined4)local_28;
  in_RDI[1].y2 = (Representation)local_28._4_4_;
  *(QWidgetData **)(in_RDI + 2) = local_20;
  in_RDI[2].x2 = (Representation)(undefined4)local_18;
  in_RDI[2].y2 = (Representation)local_18._4_4_;
  in_RDI[3].x1 = (Representation)(undefined4)local_10;
  in_RDI[3].y1 = (Representation)local_10._4_4_;
  QPointF::QPointF((QPointF *)&stack0xffffffffffffffb8);
  *(QRect **)&in_RDI[3].x2 = in_stack_ffffffffffffffb8;
  *(QRectF **)(in_RDI + 4) = in_stack_ffffffffffffffc0;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x64265d);
  if (bVar2) {
    ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x642670);
    pQVar3 = QMenuPrivate::get((QMenu *)0x642678);
    (pQVar3->sloppyState).m_parent = (QMenuSloppyState *)0x0;
    QPointer<QMenu>::operator=((QPointer<QMenu> *)this_00,(QMenu *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuSloppyState::reset()
{
    m_enabled = false;
    m_first_mouse = true;
    m_init_guard = false;
    m_use_reset_action = true;
    m_uni_dir_discarded_count = 0;
    m_time.stop();
    m_reset_action = nullptr;
    m_origin_action = nullptr;
    m_action_rect = QRect();
    m_previous_point = QPointF();
    if (m_sub_menu) {
        QMenuPrivate::get(m_sub_menu)->sloppyState.m_parent = nullptr;
        m_sub_menu = nullptr;
    }
}